

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O0

void duckdb::StringValueResult::AddValue(StringValueResult *result,idx_t buffer_pos)

{
  StringValueResult *in_RSI;
  byte *in_RDI;
  idx_t in_stack_00000028;
  StringValueResult *in_stack_00000030;
  bool in_stack_000002c7;
  idx_t in_stack_000002c8;
  char *in_stack_000002d0;
  idx_t in_stack_000002d8;
  StringValueResult *in_stack_000002e0;
  undefined1 in_stack_0000091f;
  idx_t in_stack_00000920;
  char *in_stack_00000928;
  StringValueResult *in_stack_00000930;
  idx_t in_stack_ffffffffffffffe8;
  
  if (*(StringValueResult **)(in_RDI + 0x10) <= in_RSI) {
    if ((*in_RDI & 1) == 0) {
      if ((in_RDI[2] & 1) == 0) {
        HandleMultiDelimiter(in_stack_00000030,in_stack_00000028);
        AddValueToVector(in_stack_00000930,in_stack_00000928,in_stack_00000920,
                         (bool)in_stack_0000091f);
      }
      else {
        AddPossiblyEscapedValue
                  (in_stack_000002e0,in_stack_000002d8,in_stack_000002d0,in_stack_000002c8,
                   in_stack_000002c7);
      }
    }
    else {
      AddQuotedValue(in_RSI,in_stack_ffffffffffffffe8);
    }
    *(bool **)(in_RDI + 0x10) = &(in_RSI->super_ScannerResult).unquoted;
  }
  return;
}

Assistant:

void StringValueResult::AddValue(StringValueResult &result, const idx_t buffer_pos) {
	if (result.last_position.buffer_pos > buffer_pos) {
		return;
	}
	if (result.quoted) {
		AddQuotedValue(result, buffer_pos - result.extra_delimiter_bytes);
	} else if (result.escaped) {
		AddPossiblyEscapedValue(result, buffer_pos, result.buffer_ptr + result.last_position.buffer_pos,
		                        buffer_pos - result.last_position.buffer_pos, false);
	} else {
		result.AddValueToVector(result.buffer_ptr + result.last_position.buffer_pos,
		                        result.HandleMultiDelimiter(buffer_pos));
	}
	result.last_position.buffer_pos = buffer_pos + 1;
}